

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dsatur.cpp
# Opt level: O3

void __thiscall Dsatur::assignColor(Dsatur *this,Node *node)

{
  pointer *pppNVar1;
  pointer pvVar2;
  iterator __position;
  bool bVar3;
  pointer ppNVar4;
  int iVar5;
  uint uVar6;
  pointer ppNVar7;
  Node *__tmp;
  uint uVar8;
  bool bVar9;
  vector<Node_*,_std::allocator<Node_*>_> local_50;
  Node *local_38;
  
  iVar5 = this->number_of_colors_used;
  local_38 = node;
  if (iVar5 < 1) {
    uVar6 = 1;
  }
  else {
    uVar8 = 1;
    do {
      std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_50,&node->neighbors);
      ppNVar4 = local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar3 = true;
      }
      else {
        do {
          ppNVar7 = ppNVar4 + 1;
          bVar9 = (*ppNVar4)->assignedColor == uVar8;
          bVar3 = !bVar9;
          if (bVar9) break;
          ppNVar4 = ppNVar7;
        } while (ppNVar7 !=
                 local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar5 = this->number_of_colors_used;
      uVar6 = uVar8;
    } while ((!bVar3) && (uVar6 = uVar8 + 1, bVar3 = (int)uVar8 < iVar5, uVar8 = uVar6, bVar3));
  }
  node->assignedColor = uVar6;
  if (iVar5 < (int)uVar6) {
    this->number_of_colors_used = uVar6;
    local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(8);
    local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
    *local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
     _M_start = node;
    local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<Node*,std::allocator<Node*>>,std::allocator<std::vector<Node*,std::allocator<Node*>>>>
    ::emplace_back<std::vector<Node*,std::allocator<Node*>>>
              ((vector<std::vector<Node*,std::allocator<Node*>>,std::allocator<std::vector<Node*,std::allocator<Node*>>>>
                *)&this->classes,&local_50);
    if (local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    pvVar2 = (this->classes).
             super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         *(pointer *)
          ((long)&pvVar2[(ulong)uVar6 - 1].super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                  _M_impl.super__Vector_impl_data + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&pvVar2[(ulong)uVar6 - 1].super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                 _M_impl.super__Vector_impl_data + 0x10)) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)(pvVar2 + ((ulong)uVar6 - 1)),__position,
                 &local_38);
    }
    else {
      *__position._M_current = node;
      pppNVar1 = (pointer *)
                 ((long)&pvVar2[(ulong)uVar6 - 1].
                         super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data + 8);
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return;
}

Assistant:

void Dsatur::assignColor(Node *node) {

    int color = 1;
    for(;color<=number_of_colors_used;color++){
        bool assignIt = true;
        for(auto neighbor:node->getNeighbors()){
            if(neighbor->getAssignedColor()!=-1 && neighbor->getAssignedColor() == color){
                assignIt = false;
                break;
            }
        }

        if(assignIt)
            break;
    }

    node->setAssignedColor(color);

    if(color > number_of_colors_used) {
        number_of_colors_used = color;
        classes.push_back(std::vector<Node*>(1,node));
    }else{
        classes[color-1].push_back(node);
    }

}